

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O2

MatchResult __thiscall
r_exec::PGMOverlay::_match(PGMOverlay *this,View *input,uint16_t pattern_index)

{
  Code *pCVar1;
  _Object *p_Var2;
  Atom *pAVar3;
  View *pVVar4;
  bool bVar5;
  short sVar6;
  int iVar7;
  MatchResult MVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  IPGMContext input_object;
  IPGMContext pattern_skeleton;
  
  sVar6 = r_code::Atom::asOpcode();
  input_object.super__Context.overlay = (Overlay *)this;
  input_object.view = input;
  pattern_skeleton.super__Context.overlay = (Overlay *)this;
  if (sVar6 == Opcodes::AntiPtn) {
    pCVar1 = (Code *)(input->super_View).object.object;
    iVar7 = (*(pCVar1->super__Object)._vptr__Object[4])(pCVar1,0);
    input_object.super__Context.code = (Atom *)CONCAT44(extraout_var,iVar7);
    input_object.super__Context.index = 0;
    input_object.super__Context.data = REFERENCE;
    input_object.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
    p_Var2 = (((this->super_InputLessPGMOverlay).super_Overlay.controller)->view->object).object;
    input_object.object = pCVar1;
    iVar7 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
    pAVar3 = (this->super_InputLessPGMOverlay).super_Overlay.code;
    pVVar4 = (View *)((this->super_InputLessPGMOverlay).super_Overlay.controller)->view;
    pattern_skeleton.super__Context.index = r_code::Atom::asIndex();
    pattern_skeleton.super__Context.data = STEM;
    pattern_skeleton.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
    pattern_skeleton.super__Context.code = pAVar3;
    pattern_skeleton.object = (Code *)CONCAT44(extraout_var_00,iVar7);
    pattern_skeleton.view = pVVar4;
    bVar5 = IPGMContext::match(&pattern_skeleton,&input_object);
    if (!bVar5) {
      return SUCCESS;
    }
    MVar8 = __match(this,input,pattern_index);
    if (MVar8 == SUCCESS) {
      return FAILURE;
    }
    if (MVar8 == FAILURE) {
      return SUCCESS;
    }
    if (MVar8 == IMPOSSIBLE) {
      return SUCCESS;
    }
  }
  else {
    sVar6 = r_code::Atom::asOpcode();
    if (sVar6 == Opcodes::Ptn) {
      pCVar1 = (Code *)(input->super_View).object.object;
      iVar7 = (*(pCVar1->super__Object)._vptr__Object[4])(pCVar1,0);
      input_object.super__Context.code = (Atom *)CONCAT44(extraout_var_01,iVar7);
      input_object.super__Context.index = 0;
      input_object.super__Context.data = REFERENCE;
      input_object.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
      p_Var2 = (((this->super_InputLessPGMOverlay).super_Overlay.controller)->view->object).object;
      input_object.object = pCVar1;
      iVar7 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
      pAVar3 = (this->super_InputLessPGMOverlay).super_Overlay.code;
      pVVar4 = (View *)((this->super_InputLessPGMOverlay).super_Overlay.controller)->view;
      pattern_skeleton.super__Context.index = r_code::Atom::asIndex();
      pattern_skeleton.super__Context.data = STEM;
      pattern_skeleton.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
      pattern_skeleton.super__Context.code = pAVar3;
      pattern_skeleton.object = (Code *)CONCAT44(extraout_var_02,iVar7);
      pattern_skeleton.view = pVVar4;
      bVar5 = IPGMContext::match(&pattern_skeleton,&input_object);
      if (bVar5) {
        MVar8 = __match(this,input,pattern_index);
        return MVar8;
      }
    }
  }
  return IMPOSSIBLE;
}

Assistant:

inline PGMOverlay::MatchResult PGMOverlay::_match(r_exec::View *input, uint16_t pattern_index)
{
    if (code[pattern_index].asOpcode() == Opcodes::AntiPtn) {
        IPGMContext input_object = IPGMContext::GetContextFromInput(input, this);
        IPGMContext pattern_skeleton(getObject()->get_reference(0), getView(), code, code[pattern_index + 1].asIndex(), this); // pgm_code[pattern_index] is the first atom of the pattern; pgm_code[pattern_index+1] is an iptr to the skeleton.

        if (!pattern_skeleton.match(input_object)) {
            return SUCCESS;
        }

        MatchResult r = __match(input, pattern_index);

        switch (r) {
        case IMPOSSIBLE:
        case FAILURE:
            return SUCCESS;

        case SUCCESS:
            return FAILURE;
        }
    } else if (code[pattern_index].asOpcode() == Opcodes::Ptn) {
        IPGMContext input_object = IPGMContext::GetContextFromInput(input, this);
        IPGMContext pattern_skeleton(getObject()->get_reference(0), getView(), code, code[pattern_index + 1].asIndex(), this); // pgm_code[pattern_index] is the first atom of the pattern; pgm_code[pattern_index+1] is an iptr to the skeleton.

        if (!pattern_skeleton.match(input_object)) {
            return IMPOSSIBLE;
        }

        return __match(input, pattern_index);
    }

    return IMPOSSIBLE;
}